

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.cpp
# Opt level: O3

Error uv11::poll_start(Poll *poll,int events,Callback *poll_cb)

{
  int s;
  Error EVar2;
  error_category *peVar3;
  error_code eVar1;
  
  std::function<void_(uv11::Poll_&,_std::error_code,_int)>::operator=(&poll->poll_cb,poll_cb);
  s = uv_poll_start(&(poll->super_HandleBase<uv_poll_s>).super_WrappedObject<uv_poll_s>,events,
                    poll_start::anon_class_1_0_00000001::__invoke);
  eVar1 = make_error(s);
  EVar2._M_value = eVar1._M_value;
  EVar2._4_4_ = eVar1._4_4_;
  register0x00000010 = eVar1._M_cat;
  return EVar2;
}

Assistant:

Error uv11::poll_start(Poll& poll, int events, Poll::Callback const& poll_cb) {
    poll.poll_cb = poll_cb;
    int s = ::uv_poll_start(&poll.Get(), events, [](uv_poll_t* ptr, int status, int ev) {
        Poll* p = reinterpret_cast<Poll*>(ptr->data);
        p->poll_cb(*p, make_error(status), ev);
    });

    return make_error(s);
}